

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O2

void charls::transform_quad_to_line<charls::transform_hp2<unsigned_char>,unsigned_char>
               (quad<unsigned_char> *source,size_t pixel_stride_in,uchar *destination,
               size_t pixel_stride,transform_hp2<unsigned_char> *transform,uint32_t mask)

{
  byte bVar1;
  triplet<unsigned_char> tVar2;
  size_t sVar3;
  
  if (pixel_stride <= pixel_stride_in) {
    pixel_stride_in = pixel_stride;
  }
  for (sVar3 = 0; pixel_stride_in != sVar3; sVar3 = sVar3 + 1) {
    bVar1 = source[sVar3].field_0.v4;
    tVar2 = transform_hp2<unsigned_char>::operator()
                      (transform,source[sVar3].super_triplet<unsigned_char>.field_0.v1 & mask,
                       source[sVar3].super_triplet<unsigned_char>.field_1.v2 & mask,
                       source[sVar3].super_triplet<unsigned_char>.field_2.v3 & mask);
    ((anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1 *)(destination + sVar3))->v1 =
         (uchar)tVar2.field_0;
    ((anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3 *)(destination + sVar3 + pixel_stride))->
    v2 = (uchar)tVar2.field_1;
    ((anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5 *)
    (destination + sVar3 + pixel_stride * 2))->v3 = (uchar)tVar2.field_2;
    destination[sVar3 + pixel_stride * 3] = bVar1 & (byte)mask;
  }
  return;
}

Assistant:

void transform_quad_to_line(const quad<PixelType>* source, const size_t pixel_stride_in, PixelType* destination,
                            const size_t pixel_stride, Transform& transform, const uint32_t mask) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const quad<PixelType> color{source[i]};
        const quad<PixelType> color_transformed(transform(color.v1 & mask, color.v2 & mask, color.v3 & mask),
                                                color.v4 & mask);

        destination[i] = color_transformed.v1;
        destination[i + pixel_stride] = color_transformed.v2;
        destination[i + 2 * pixel_stride] = color_transformed.v3;
        destination[i + 3 * pixel_stride] = color_transformed.v4;
    }
}